

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O1

string * __thiscall
flatbuffers::cpp::CppGenerator::GenVectorForceAlign
          (string *__return_storage_ptr__,CppGenerator *this,FieldDef *field,string *field_size)

{
  BaseType BVar1;
  StructDef *def;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  const_iterator cVar5;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  ulong *puVar9;
  ulong uVar10;
  size_type *psVar11;
  long lVar12;
  char cVar13;
  uint __len;
  Type vtype;
  string __str;
  long *local_1b8;
  undefined8 local_1b0;
  long local_1a8;
  undefined8 uStack_1a0;
  _Alloc_hider local_198;
  StructDef *local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  ulong *local_178;
  long local_170;
  ulong local_168 [2];
  ulong *local_158;
  long local_150;
  ulong local_148;
  long lStack_140;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8 [2];
  long local_a8 [2];
  string *local_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  string local_50;
  
  BVar1 = (field->value).type.base_type;
  if ((BVar1 != BASE_TYPE_VECTOR) && (BVar1 != BASE_TYPE_VECTOR64)) {
    __assert_fail("IsVector(field.value.type)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_cpp.cpp"
                  ,0xb8b,
                  "std::string flatbuffers::cpp::CppGenerator::GenVectorForceAlign(const FieldDef &, const std::string &)"
                 );
  }
  local_198._M_p = (pointer)&local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"force_align","");
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  *)&(field->super_Definition).attributes,(key_type *)&local_198);
  if ((_Rb_tree_header *)cVar5._M_node ==
      &(field->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
    lVar12 = 0;
  }
  else {
    lVar12 = *(long *)(cVar5._M_node + 2);
  }
  local_98 = field_size;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_p != &local_188) {
    operator_delete(local_198._M_p,local_188._M_allocated_capacity + 1);
  }
  if (lVar12 == 0) {
    uVar4 = 1;
  }
  else {
    uVar4 = atoi(*(char **)(lVar12 + 0x20));
  }
  if ((int)uVar4 < 2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  local_198._M_p._0_4_ = (field->value).type.element;
  def = (field->value).type.struct_def;
  local_188._M_allocated_capacity = (size_type)(field->value).type.enum_def;
  local_188._8_2_ = (field->value).type.fixed_length;
  local_198._M_p._4_4_ = 0;
  if ((BaseType)local_198._M_p == BASE_TYPE_STRUCT) {
    cVar13 = def->fixed;
  }
  else {
    cVar13 = '\0';
  }
  local_190 = def;
  if (cVar13 == '\0') {
    GenTypeWire_abi_cxx11_(&local_70,this,(Type *)&local_198,"",false,field->offset64);
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    BaseGenerator::WrapInNameSpace
              (&local_70,&this->super_BaseGenerator,&def->super_Definition,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"_fbb.ForceVectorAlignment","")
  ;
  plVar6 = (long *)std::__cxx11::string::append((char *)local_b8);
  local_138 = &local_128;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_128 = *plVar8;
    lStack_120 = plVar6[3];
  }
  else {
    local_128 = *plVar8;
    local_138 = (long *)*plVar6;
  }
  local_130 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_80 = *plVar8;
    lStack_78 = plVar6[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar8;
    local_90 = (long *)*plVar6;
  }
  local_88 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(local_98->_M_dataplus)._M_p);
  local_118 = &local_108;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_108 = *plVar8;
    lStack_100 = plVar6[3];
  }
  else {
    local_108 = *plVar8;
    local_118 = (long *)*plVar6;
  }
  local_110 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
  local_f8 = &local_e8;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_e8 = *plVar8;
    lStack_e0 = plVar6[3];
  }
  else {
    local_e8 = *plVar8;
    local_f8 = (long *)*plVar6;
  }
  local_f0 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_f8,(ulong)local_70._M_dataplus._M_p);
  local_d8 = &local_c8;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_c8 = *plVar8;
    lStack_c0 = plVar6[3];
  }
  else {
    local_c8 = *plVar8;
    local_d8 = (long *)*plVar6;
  }
  local_d0 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_148 = *puVar9;
    lStack_140 = plVar6[3];
    local_158 = &local_148;
  }
  else {
    local_148 = *puVar9;
    local_158 = (ulong *)*plVar6;
  }
  local_150 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  __len = 1;
  if (9 < uVar4) {
    uVar10 = (ulong)uVar4;
    uVar3 = 4;
    do {
      __len = uVar3;
      if (uVar10 < 100) {
        __len = __len - 2;
        goto LAB_0019b4da;
      }
      if (uVar10 < 1000) {
        __len = __len - 1;
        goto LAB_0019b4da;
      }
      if (uVar10 < 10000) goto LAB_0019b4da;
      bVar2 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      uVar3 = __len + 4;
    } while (bVar2);
    __len = __len + 1;
  }
LAB_0019b4da:
  local_178 = local_168;
  std::__cxx11::string::_M_construct((ulong)&local_178,(char)__len);
  std::__detail::__to_chars_10_impl<unsigned_long_long>((char *)local_178,__len,(ulong)uVar4);
  uVar10 = 0xf;
  if (local_158 != &local_148) {
    uVar10 = local_148;
  }
  if (uVar10 < (ulong)(local_170 + local_150)) {
    uVar10 = 0xf;
    if (local_178 != local_168) {
      uVar10 = local_168[0];
    }
    if ((ulong)(local_170 + local_150) <= uVar10) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_158);
      goto LAB_0019b561;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_178);
LAB_0019b561:
  local_1b8 = &local_1a8;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_1a8 = *plVar6;
    uStack_1a0 = puVar7[3];
  }
  else {
    local_1a8 = *plVar6;
    local_1b8 = (long *)*puVar7;
  }
  local_1b0 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    lVar12 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar12;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  if (local_178 != local_168) {
    operator_delete(local_178,local_168[0] + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,local_128 + 1);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenVectorForceAlign(const FieldDef &field,
                                  const std::string &field_size) {
    FLATBUFFERS_ASSERT(IsVector(field.value.type));
    // Get the value of the force_align attribute.
    const auto *force_align = field.attributes.Lookup("force_align");
    const int align = force_align ? atoi(force_align->constant.c_str()) : 1;
    // Generate code to do force_align for the vector.
    if (align > 1) {
      const auto vtype = field.value.type.VectorType();
      const std::string &type =
          IsStruct(vtype) ? WrapInNameSpace(*vtype.struct_def)
                          : GenTypeWire(vtype, "", false, field.offset64);
      return std::string("_fbb.ForceVectorAlignment") +
             (field.offset64 ? "64" : "") + "(" + field_size + ", sizeof(" +
             type + "), " + std::to_string(static_cast<long long>(align)) +
             ");";
    }
    return "";
  }